

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_ComparableSetsDifferentLength_Test::
~Btree_ComparableSetsDifferentLength_Test(Btree_ComparableSetsDifferentLength_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, ComparableSetsDifferentLength) {
        phmap::btree_set<int> s1 = {1, 2};
        phmap::btree_set<int> s2 = {1, 2, 3};
        EXPECT_LT(s1, s2);
        EXPECT_LE(s1, s2);
        EXPECT_GT(s2, s1);
        EXPECT_GE(s2, s1);
    }